

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
* parse_query_string_abi_cxx11_
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
             *__return_storage_ptr__,string_view in_query_string)

{
  undefined1 local_20 [8];
  string_view in_query_string_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  *result;
  
  in_query_string_local._M_len = (size_t)in_query_string._M_str;
  local_20 = (undefined1  [8])in_query_string._M_len;
  in_query_string_local._M_str = (char *)__return_storage_ptr__;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
            (__return_storage_ptr__);
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)local_20);
  jessilib::
  deserialize_html_form<char,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_nullptr>
            (&__return_storage_ptr__->second,&__return_storage_ptr__->first);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, query_table_type> parse_query_string(std::string_view in_query_string) {
	std::pair<std::string, query_table_type> result;
	result.first = in_query_string;
	jessilib::deserialize_html_form(result.second, result.first);
	return result;
}